

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void propagatemark(global_State *g)

{
  byte bVar1;
  lua_State *L;
  StkId pTVar2;
  GCObject *pGVar3;
  CallInfo *pCVar4;
  lua_CFunction p_Var5;
  bool bVar6;
  lua_Alloc *pp_Var7;
  uint uVar8;
  int iVar9;
  TValue *pTVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  Table *events;
  ulong uVar15;
  long lVar16;
  Proto *p;
  GCObject **ppGVar17;
  StkId pTVar18;
  global_State *n;
  global_State *pgVar19;
  bool bVar20;
  
  L = (lua_State *)g->gray;
  bVar1 = L->marked;
  L->marked = bVar1 | 4;
  switch(L->tt) {
  case '\x05':
    g->gray = (GCObject *)L->stack_last;
    events = (Table *)L->oldpc;
    if (events == (Table *)0x0) {
LAB_0010b735:
      pgVar19 = L->l_G;
      bVar1 = *(byte *)((long)&L->nci + 1);
      lVar12 = 8;
      for (uVar15 = 0; uVar15 < *(uint *)&L->status; uVar15 = uVar15 + 1) {
        if (((*(byte *)((long)&L->top->value_ + lVar12) & 0x40) != 0) &&
           (pGVar3 = *(GCObject **)((long)L->top + lVar12 + -8), (pGVar3->marked & 3) != 0)) {
          reallymarkobject(g,pGVar3);
        }
        lVar12 = lVar12 + 0x10;
      }
      for (n = L->l_G; n < (global_State *)(&pgVar19->frealloc + (long)(1 << (bVar1 & 0x1f)) * 4);
          n = (global_State *)&n->GCmemtrav) {
        uVar8 = *(uint *)&n->ud;
        if (uVar8 == 0) {
          removeentry((Node *)n);
        }
        else {
          if (((n->GCdebt & 0x40) != 0) && ((((GCObject *)n->totalbytes)->marked & 3) != 0)) {
            reallymarkobject(g,(GCObject *)n->totalbytes);
            uVar8 = *(uint *)&n->ud;
          }
          if (((uVar8 & 0x40) != 0) && ((((GCObject *)n->frealloc)->marked & 3) != 0)) {
            reallymarkobject(g,(GCObject *)n->frealloc);
          }
        }
      }
    }
    else {
      if ((events->flags & 8) == 0) {
        pTVar10 = luaT_gettm(events,TM_MODE,g->tmname[3]);
        events = (Table *)L->oldpc;
        if (events != (Table *)0x0) goto LAB_0010b6c0;
      }
      else {
        pTVar10 = (TValue *)0x0;
LAB_0010b6c0:
        if ((events->marked & 3) != 0) {
          reallymarkobject(g,(GCObject *)events);
        }
      }
      if ((pTVar10 == (TValue *)0x0) || ((pTVar10->tt_ & 0xfU) != 4)) goto LAB_0010b735;
      p_Var5 = (pTVar10->value_).f;
      pcVar13 = strchr((char *)(p_Var5 + 0x18),0x6b);
      pcVar14 = strchr((char *)(p_Var5 + 0x18),0x76);
      if (pcVar13 == (char *)0x0 && pcVar14 == (char *)0x0) goto LAB_0010b735;
      L->marked = L->marked & 0xfb;
      if (pcVar13 == (char *)0x0) {
        bVar1 = *(byte *)((long)&L->nci + 1);
        pgVar19 = L->l_G;
        pp_Var7 = &pgVar19->frealloc;
        bVar20 = *(int *)&L->status != 0;
        for (; pgVar19 < (global_State *)(pp_Var7 + (long)(1 << (bVar1 & 0x1f)) * 4);
            pgVar19 = (global_State *)&pgVar19->GCmemtrav) {
          if (*(int *)&pgVar19->ud == 0) {
            removeentry((Node *)pgVar19);
          }
          else {
            if (((pgVar19->GCdebt & 0x40) != 0) &&
               ((((GCObject *)pgVar19->totalbytes)->marked & 3) != 0)) {
              reallymarkobject(g,(GCObject *)pgVar19->totalbytes);
            }
            bVar6 = !bVar20;
            bVar20 = true;
            if (bVar6) {
              iVar9 = iscleared(g,(TValue *)pgVar19);
              bVar20 = iVar9 != 0;
            }
          }
        }
        if (g->gcstate == '\0') {
          lVar12 = 0x78;
        }
        else {
          lVar12 = 0x80;
          if (!bVar20) goto LAB_0010b880;
        }
        L->stack_last = *(StkId *)((long)&g->frealloc + lVar12);
        *(lua_State **)((long)&g->frealloc + lVar12) = L;
      }
      else if (pcVar14 == (char *)0x0) {
        traverseephemeron(g,(Table *)L);
      }
      else {
        L->stack_last = (StkId)g->allweak;
        g->allweak = (GCObject *)L;
      }
    }
LAB_0010b880:
    if (L->ci == (CallInfo *)0x0) {
      lVar12 = 0;
    }
    else {
      lVar12 = (long)(1 << (*(byte *)((long)&L->nci + 1) & 0x1f)) << 5;
    }
    lVar12 = (ulong)*(uint *)&L->status * 0x10 + lVar12 + 0x38;
    break;
  case '\x06':
    g->gray = (GCObject *)L->top;
    pgVar19 = L->l_G;
    if ((pgVar19 != (global_State *)0x0) && (((ulong)pgVar19->ud & 0x300) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar19);
    }
    for (uVar15 = 0; uVar11 = (ulong)(byte)L->nci, uVar15 < uVar11; uVar15 = uVar15 + 1) {
      pCVar4 = (&L->ci)[uVar15];
      if (pCVar4 != (CallInfo *)0x0) {
        pTVar18 = pCVar4->func;
        if ((pTVar18 == (StkId)&pCVar4->previous) || (g->gcstate == '\b')) {
          if (((pTVar18->tt_ & 0x40) != 0) && ((((pTVar18->value_).gc)->marked & 3) != 0)) {
            reallymarkobject(g,(pTVar18->value_).gc);
          }
        }
        else {
          *(undefined4 *)&pCVar4->next = 1;
        }
      }
    }
    lVar12 = uVar11 * 8 + 0x20;
    break;
  case '\a':
    goto switchD_0010b3b6_caseD_7;
  case '\b':
    g->gray = L->gclist;
    L->gclist = g->grayagain;
    g->grayagain = (GCObject *)L;
    L->marked = bVar1 & 0xfb;
    pTVar18 = L->stack;
    if (pTVar18 == (StkId)0x0) {
      lVar12 = 1;
    }
    else {
      for (; pTVar18 < L->top; pTVar18 = pTVar18 + 1) {
        if (((pTVar18->tt_ & 0x40) != 0) && ((((pTVar18->value_).gc)->marked & 3) != 0)) {
          reallymarkobject(g,(pTVar18->value_).gc);
        }
      }
      if (g->gcstate == '\b') {
        iVar9 = L->stacksize;
        pTVar2 = L->stack;
        for (; pTVar18 < pTVar2 + iVar9; pTVar18 = pTVar18 + 1) {
          pTVar18->tt_ = 0;
        }
        if ((L->twups == L) && (L->openupval != (UpVal *)0x0)) {
          L->twups = g->twups;
          g->twups = L;
        }
      }
      else if (g->gckind != '\x01') {
        luaD_shrinkstack(L);
      }
      lVar12 = (long)L->stacksize * 0x10 + (ulong)L->nci * 0x48 + 0xd0;
    }
    break;
  case '\t':
    g->gray = (GCObject *)(L->base_ci).previous;
    pTVar18 = (L->base_ci).func;
    if ((pTVar18 != (StkId)0x0) && ((pTVar18->tt_ & 0x300) != 0)) {
      (L->base_ci).func = (StkId)0x0;
    }
    pGVar3 = (GCObject *)(L->base_ci).top;
    if ((pGVar3 != (GCObject *)0x0) && ((pGVar3->marked & 3) != 0)) {
      reallymarkobject(g,pGVar3);
    }
    lVar12 = 8;
    for (lVar16 = 0; lVar16 < *(int *)((long)&L->top + 4); lVar16 = lVar16 + 1) {
      if (((*(byte *)((long)&L->stack_last->value_ + lVar12) & 0x40) != 0) &&
         (pGVar3 = *(GCObject **)((long)L->stack_last + lVar12 + -8), (pGVar3->marked & 3) != 0)) {
        reallymarkobject(g,pGVar3);
      }
      lVar12 = lVar12 + 0x10;
    }
    lVar16 = 0;
    for (lVar12 = 0; lVar12 < *(int *)&L->top; lVar12 = lVar12 + 1) {
      pGVar3 = *(GCObject **)((long)L->errorJmp->b[0].__jmpbuf + lVar16 + -8);
      if ((pGVar3 != (GCObject *)0x0) && ((pGVar3->marked & 3) != 0)) {
        reallymarkobject(g,pGVar3);
      }
      lVar16 = lVar16 + 0x10;
    }
    for (lVar12 = 0; lVar12 < *(int *)&L->ci; lVar12 = lVar12 + 1) {
      pGVar3 = (GCObject *)(&L->openupval->v)[lVar12];
      if ((pGVar3 != (GCObject *)0x0) && ((pGVar3->marked & 3) != 0)) {
        reallymarkobject(g,pGVar3);
      }
    }
    lVar16 = 0;
    for (lVar12 = 0; iVar9 = *(int *)((long)&L->ci + 4), lVar12 < iVar9; lVar12 = lVar12 + 1) {
      pGVar3 = *(GCObject **)((long)&L->twups->next + lVar16);
      if ((pGVar3 != (GCObject *)0x0) && ((pGVar3->marked & 3) != 0)) {
        reallymarkobject(g,pGVar3);
      }
      lVar16 = lVar16 + 0x10;
    }
    lVar12 = (long)((iVar9 + *(int *)((long)&L->top + 4) + *(int *)&L->top) * 0x10 +
                    (*(int *)((long)&L->l_G + 4) + *(int *)&L->l_G) * 4 + *(int *)&L->ci * 8 + 0x78)
    ;
    break;
  default:
    if (L->tt != '&') {
      return;
    }
    g->gray = (GCObject *)L->top;
    ppGVar17 = (GCObject **)&L->oldpc;
    for (uVar15 = 0; bVar1 = (byte)L->nci, uVar15 < bVar1; uVar15 = uVar15 + 1) {
      if ((((ulong)*ppGVar17 & 0x40) != 0) &&
         (((ulong)((CallInfo *)ppGVar17[-1])->top & 0x300) != 0)) {
        reallymarkobject(g,ppGVar17[-1]);
      }
      ppGVar17 = ppGVar17 + 2;
    }
    lVar12 = (ulong)bVar1 * 0x10 + 0x20;
  }
  g->GCmemtrav = g->GCmemtrav + lVar12;
switchD_0010b3b6_caseD_7:
  return;
}

Assistant:

static void propagatemark(global_State *g) {
    lu_mem size;
    GCObject *o = g->gray;
    lua_assert(isgray(o));
    gray2black(o);
    switch (o->tt) {
        case LUA_TTABLE: {
            Table *h = gco2t(o);
            g->gray = h->gclist;  /* remove from 'gray' list */
            size = traversetable(g, h);
            break;
        }
        case LUA_TLCL: {
            LClosure *cl = gco2lcl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseLclosure(g, cl);
            break;
        }
        case LUA_TCCL: {
            CClosure *cl = gco2ccl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseCclosure(g, cl);
            break;
        }
        case LUA_TTHREAD: {
            lua_State *th = gco2th(o);
            g->gray = th->gclist;  /* remove from 'gray' list */
            linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
            black2gray(o);
            size = traversethread(g, th);
            break;
        }
        case LUA_TPROTO: {
            Proto *p = gco2p(o);
            g->gray = p->gclist;  /* remove from 'gray' list */
            size = traverseproto(g, p);
            break;
        }
        default:
            lua_assert(0);
            return;
    }
    g->GCmemtrav += size;
}